

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCustomLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  LayerUnion LVar4;
  long *plVar5;
  size_type *psVar6;
  uint uVar7;
  long lVar8;
  InternalMetadataWithArenaLite *pIVar9;
  long lVar10;
  string err;
  string err_1;
  Result r;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_type *local_60;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  Result *local_38;
  
  Result::Result((Result *)&local_60);
  validateInputCount((Result *)local_a8,layer,1,-1);
  local_60 = (size_type *)local_a8;
  std::__cxx11::string::operator=((string *)&local_58,(string *)&local_a0);
  if (local_a0._M_p != local_98 + 8) {
    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_60);
  if (bVar3) {
    validateOutputCount((Result *)local_a8,layer,1,-1);
    local_60 = (size_type *)local_a8;
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_a0);
    if (local_a0._M_p != local_98 + 8) {
      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
    }
  }
  if (layer->_oneof_case_[0] == 500) {
    LVar4 = layer->layer_;
  }
  else {
    LVar4.custom_ = Specification::CustomLayerParams::default_instance();
  }
  if (((ArenaStringPtr *)&(LVar4.scale_)->bias_)->ptr_->_M_string_length == 0) {
    std::operator+(&local_80,"Custom layer ",(layer->name_).ptr_);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_98._0_8_ = *psVar6;
      local_98._8_8_ = plVar5[3];
      local_a8 = (undefined1  [8])local_98;
    }
    else {
      local_98._0_8_ = *psVar6;
      local_a8 = (undefined1  [8])*plVar5;
    }
    local_a0._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,local_98._0_8_ + 1);
    }
  }
  else {
    local_38 = __return_storage_ptr__;
    if (layer->_oneof_case_[0] == 500) {
      LVar4 = layer->layer_;
    }
    else {
      LVar4.custom_ = Specification::CustomLayerParams::default_instance();
    }
    pIVar9 = &(LVar4.batchnorm_)->mean_->_internal_metadata_;
    if ((LVar4.batchnorm_)->mean_ == (WeightParams *)0x0) {
      pIVar9 = (InternalMetadataWithArenaLite *)0x0;
    }
    lVar8 = (long)(((RepeatedPtrField<CoreML::Specification::WeightParams> *)
                   &(LVar4.convolution_)->kernelsize_)->super_RepeatedPtrFieldBase).current_size_;
    if (lVar8 != 0) {
      lVar10 = 0;
      do {
        lVar2 = *(long *)((long)&(pIVar9->
                                 super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                 ).ptr_ + lVar10);
        bVar3 = 0 < *(int *)(lVar2 + 0x10);
        uVar7 = bVar3 + 1;
        if (*(long *)(*(long *)(lVar2 + 0x28) + 8) == 0) {
          uVar7 = (uint)bVar3;
        }
        if (((uVar7 - (*(long *)(*(long *)(lVar2 + 0x30) + 8) == 0)) + 2) -
            (uint)(*(long *)(*(long *)(lVar2 + 0x38) + 8) == 0) != 1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,"Custom layer ",(layer->name_).ptr_);
          plVar5 = (long *)std::__cxx11::string::append(local_a8);
          psVar6 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_80.field_2._M_allocated_capacity = *psVar6;
            local_80.field_2._8_8_ = plVar5[3];
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          }
          else {
            local_80.field_2._M_allocated_capacity = *psVar6;
            local_80._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_80._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          if (local_a8 != (undefined1  [8])local_98) {
            operator_delete((void *)local_a8,local_98._0_8_ + 1);
          }
          Result::Result((Result *)local_a8,INVALID_MODEL_PARAMETERS,&local_80);
          local_60 = (size_type *)local_a8;
          std::__cxx11::string::operator=((string *)&local_58,(string *)&local_a0);
          if (local_a0._M_p != local_98 + 8) {
            operator_delete(local_a0._M_p,local_98._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        lVar10 = lVar10 + 8;
      } while (lVar8 * 8 != lVar10);
    }
    *(size_type **)local_38 = local_60;
    paVar1 = &(local_38->m_message).field_2;
    (local_38->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p == &local_48) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]);
      *(undefined8 *)((long)&(local_38->m_message).field_2 + 8) = local_48._8_8_;
    }
    else {
      (local_38->m_message)._M_dataplus._M_p = local_58._M_p;
      (local_38->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]);
    }
    (local_38->m_message)._M_string_length = local_50;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    __return_storage_ptr__ = local_38;
    local_58._M_p = (pointer)&local_48;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,
                    CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCustomLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, -1);
    }

    if (layer.custom().classname().size() == 0) {
        std::string err = "Custom layer " + layer.name() + " has an empty 'className' field. This field is required in order for Core ML to link to the implementation for this custom class.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    for (const auto& param: layer.custom().weights()) {
        if (!checkSingleWeightType(param)) {
            std::string err = "Custom layer " + layer.name() + " has a weights parameter with multiple types filled in.  The WeightParams message should be treated as a oneof.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return r;
}